

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

int kwssys::kwsysUnPutEnv(string *env)

{
  char *pcVar1;
  ulong in_RDI;
  string name;
  size_t pos;
  string local_30 [32];
  long local_10;
  ulong local_8;
  
  local_8 = in_RDI;
  local_10 = std::__cxx11::string::find((char)in_RDI,0x3d);
  if (local_10 == -1) {
    pcVar1 = (char *)std::__cxx11::string::c_str();
    unsetenv(pcVar1);
  }
  else {
    std::__cxx11::string::substr((ulong)local_30,local_8);
    pcVar1 = (char *)std::__cxx11::string::c_str();
    unsetenv(pcVar1);
    std::__cxx11::string::~string(local_30);
  }
  return 0;
}

Assistant:

static int kwsysUnPutEnv(const std::string& env)
{
  size_t pos = env.find('=');
  if (pos != std::string::npos) {
    std::string name = env.substr(0, pos);
    unsetenv(name.c_str());
  } else {
    unsetenv(env.c_str());
  }
  return 0;
}